

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

void __thiscall
cfd::core::MerkleBlock::MerkleBlock
          (MerkleBlock *this,Block *block,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  pointer pTVar1;
  pointer pTVar2;
  bool __x;
  pointer pTVar3;
  uint64_t uVar4;
  Txid *target_txid;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *__range3;
  pointer pTVar5;
  uint64_t height;
  Txid *txid;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> txid_list;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> local_98;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&local_98,&block->txids_)
  ;
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            (&local_58,
             (long)local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  pTVar2 = local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar5 = local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pTVar3 = (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar3 == pTVar1) {
        __x = false;
      }
      else {
        do {
          __x = Txid::Equals(pTVar3,pTVar5);
          pTVar3 = pTVar3 + 1;
        } while (pTVar3 != pTVar1 && !__x);
      }
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&local_58,__x);
      pTVar5 = pTVar5 + 1;
      pTVar3 = local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    } while (pTVar5 != pTVar2);
  }
  uVar4 = (long)pTVar3 -
          (long)local_98.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                _M_impl.super__Vector_impl_data._M_start >> 5;
  this->transaction_count = uVar4;
  pTVar2 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  pTVar3 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar5 = pTVar2;
  if (pTVar3 != pTVar2) {
    do {
      (**pTVar5->_vptr_Txid)(pTVar5);
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar3);
    (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
    uVar4 = this->transaction_count;
  }
  height = 0xffffffffffffffff;
  do {
    height = height + 1;
  } while (1 < (1L << ((byte)height & 0x3f)) + (uVar4 - 1) >> ((byte)height & 0x3f));
  ::std::vector<bool,_std::allocator<bool>_>::vector(&local_80,&local_58);
  TraverseAndBuild(this,height,0,&local_98,&local_80);
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector(&local_98);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

MerkleBlock::MerkleBlock(const Block& block, const std::vector<Txid>& txids) {
  std::vector<bool> target_indexes;
  auto txid_list = block.GetTxids();
  target_indexes.reserve(txid_list.size());
  for (const auto& txid : txid_list) {
    bool is_find = false;
    for (const auto& target_txid : txids) {
      if (target_txid.Equals(txid)) {
        is_find = true;
        break;
      }
    }
    target_indexes.push_back(is_find);
  }

  transaction_count = static_cast<uint64_t>(txid_list.size());
  bits_.clear();
  txids_.clear();

  uint64_t height = 0;
  while (CalcTreeWidth(transaction_count, height) > 1) ++height;

  TraverseAndBuild(height, 0, txid_list, target_indexes);
}